

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chatwindow.cpp
# Opt level: O3

void __thiscall ChatWindow::disconnectedFromServer(ChatWindow *this)

{
  QArrayData *pQVar1;
  QArrayData *local_40 [3];
  QArrayData *local_28 [3];
  
  QMetaObject::tr((char *)local_28,(char *)&staticMetaObject,0x10a8cb);
  QMetaObject::tr((char *)local_40,(char *)&staticMetaObject,0x10a8d8);
  QMessageBox::warning(this,local_28,local_40,0x400,0);
  if (local_40[0] != (QArrayData *)0x0) {
    LOCK();
    (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_40[0],2,8);
    }
  }
  if (local_28[0] != (QArrayData *)0x0) {
    LOCK();
    (local_28[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_28[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_28[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_28[0],2,8);
    }
  }
  QWidget::setEnabled(SUB81(*(undefined8 *)(this->ui + 0x20),0));
  QWidget::setEnabled(SUB81(*(undefined8 *)(this->ui + 0x18),0));
  QWidget::setEnabled(SUB81(*(undefined8 *)(this->ui + 0x10),0));
  QWidget::setEnabled(SUB81(*(undefined8 *)(this->ui + 8),0));
  if ((this->m_lastUserName).d.ptr != (char16_t *)0x0) {
    pQVar1 = &((this->m_lastUserName).d.d)->super_QArrayData;
    (this->m_lastUserName).d.d = (Data *)0x0;
    (this->m_lastUserName).d.ptr = (char16_t *)0x0;
    (this->m_lastUserName).d.size = 0;
    if (pQVar1 != (QArrayData *)0x0) {
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar1,2,8);
      }
    }
  }
  return;
}

Assistant:

void ChatWindow::disconnectedFromServer()
{
    // if the client loses connection to the server
    // comunicate the event to the user via a message box
    QMessageBox::warning(this, tr("Disconnected"), tr("The host terminated the connection"));
    // disable the ui to send and display messages
    ui->sendButton->setEnabled(false);
    ui->messageEdit->setEnabled(false);
    ui->chatView->setEnabled(false);
    // enable the button to connect to the server again
    ui->connectButton->setEnabled(true);
    // reset the last printed username
    m_lastUserName.clear();
}